

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O3

void __thiscall Imath_3_2::Euler<float>::extract(Euler<float> *this,Matrix33<float> *M)

{
  undefined8 uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float local_138 [4];
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  float local_e0;
  float local_dc;
  undefined8 local_d8;
  float local_d0;
  float local_cc;
  undefined8 local_c8;
  undefined8 local_c0;
  float local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  bVar2 = this->field_0xc;
  bVar3 = bVar2 >> 3;
  uVar9 = bVar3 & 3;
  if ((bVar2 & 4) == 0) {
    iVar4 = 2;
    if ((bVar3 & 3) != 0) {
      iVar4 = uVar9 - 1;
    }
    uVar5 = ((uint)((byte)uVar9 < 2) * 3 + uVar9) - 2;
  }
  else {
    iVar4 = (uint)((byte)uVar9 < 2) * 3 + uVar9 + -2;
    uVar5 = 2;
    if ((bVar3 & 3) != 0) {
      uVar5 = uVar9 - 1;
    }
  }
  lVar8 = (long)iVar4;
  if ((bVar2 & 2) == 0) {
    uVar7 = (ulong)uVar5;
    fVar10 = atan2f(M->x[lVar8][uVar7],*(float *)((long)M->x + uVar7 * 0x10));
    (this->super_Vec3<float>).x = fVar10;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar10 = -fVar10;
    }
    uVar6 = (ulong)(uVar9 * 4);
    *(float *)((long)local_138 + uVar6) = fVar10;
    fVar10 = local_138[2];
    local_c8 = 0;
    local_c0 = 0x3f80000000000000;
    local_108._0_4_ = cosf(local_138[2]);
    local_128 = CONCAT44(local_128._4_4_,local_138[1]);
    local_b8 = cosf(local_138[1]);
    local_98._0_4_ = local_138[0];
    uStack_b4 = extraout_XMM0_Db;
    uStack_b0 = extraout_XMM0_Dc;
    uStack_ac = extraout_XMM0_Dd;
    local_118 = cosf(local_138[0]);
    fVar10 = sinf(fVar10);
    local_a8._0_4_ = sinf((float)local_128);
    local_a8._4_4_ = extraout_XMM0_Db_00;
    local_a8._8_4_ = extraout_XMM0_Dc_00;
    local_a8._12_4_ = extraout_XMM0_Dd_00;
    fVar11 = sinf((float)local_98._0_4_);
    fVar21 = (float)local_108._0_4_ * (float)local_a8._0_4_ * fVar11 - fVar10 * local_118;
    fVar18 = (float)local_108._0_4_ * local_118 + fVar10 * (float)local_a8._0_4_ * fVar11;
    fVar26 = fVar10 * fVar11 + local_118 * (float)local_108._0_4_ * (float)local_a8._0_4_;
    fVar28 = local_118 * fVar10 * (float)local_a8._0_4_ - (float)local_108._0_4_ * fVar11;
    fVar12 = local_b8 * fVar10 * 0.0;
    fVar17 = -(float)local_a8._0_4_ * 0.0;
    fVar23 = (float)local_108._0_4_ * local_b8 + fVar12 + fVar17;
    fVar22 = (float)local_108._0_4_ * local_b8 * 0.0;
    fVar20 = local_b8 * fVar10 + fVar22 + fVar17;
    fVar22 = fVar22 + fVar12;
    fVar17 = fVar17 + fVar22;
    local_98._0_8_ = CONCAT44(local_a8._4_4_,fVar17) ^ 0x8000000000000000;
    local_98._8_4_ = local_a8._8_4_ ^ 0x80000000;
    local_98._12_4_ = local_a8._12_4_ ^ 0x80000000;
    fVar22 = fVar22 - (float)local_a8._0_4_;
    fVar10 = fVar18 * 0.0;
    fVar12 = local_b8 * fVar11 * 0.0;
    fVar24 = fVar21 + fVar10 + fVar12;
    fVar21 = fVar21 * 0.0;
    fVar19 = fVar18 + fVar21 + fVar12;
    fVar21 = fVar21 + fVar10;
    local_88._0_4_ = local_b8 * fVar11 + fVar21;
    local_88._4_4_ = uStack_b4;
    local_88._8_4_ = uStack_b0;
    local_88._12_4_ = uStack_ac;
    fVar21 = fVar21 + fVar12;
    fVar10 = fVar28 * 0.0;
    fVar11 = local_b8 * local_118 * 0.0;
    fVar25 = fVar26 + fVar10 + fVar11;
    fVar26 = fVar26 * 0.0;
    fVar29 = fVar28 + fVar26 + fVar11;
    fVar26 = fVar26 + fVar10;
    local_b8 = local_b8 * local_118 + fVar26;
    fVar26 = fVar26 + fVar11;
    fVar10 = M->x[0][2];
    fVar11 = M->x[1][2];
    fVar12 = M->x[2][2];
    fVar18 = fVar22 * fVar12 + fVar23 * fVar10 + fVar20 * fVar11;
    local_a8 = ZEXT416((uint)fVar18);
    local_58 = (float)local_88._0_4_ * fVar12 + fVar24 * fVar10 + fVar19 * fVar11;
    uStack_54 = uStack_b4;
    uStack_50 = uStack_b0;
    uStack_4c = uStack_ac;
    local_68 = local_b8 * fVar12 + fVar25 * fVar10 + fVar29 * fVar11;
    uStack_64 = uStack_b4;
    uStack_60 = uStack_b0;
    uStack_5c = uStack_ac;
    local_48 = ZEXT416((uint)local_c8._4_4_);
    local_78 = fVar12 * (float)local_c0 + fVar10 * (float)local_c8 + fVar11 * local_c8._4_4_;
    fVar10 = local_c8._4_4_ * 0.0;
    fVar12 = (float)local_c8 * 0.0;
    local_ec = fVar22 * 0.0 + fVar23 * 0.0 + fVar20 * 0.0 + fVar17;
    local_108 = ZEXT416((uint)local_ec);
    fVar17 = fVar17 * 0.0;
    local_118 = (float)local_88._0_4_ * 0.0 + fVar24 * 0.0 + fVar19 * 0.0 + fVar21;
    uStack_114 = uStack_b4;
    uStack_110 = uStack_b0;
    uStack_10c = uStack_ac;
    fVar21 = fVar21 * 0.0;
    fVar11 = fVar26 * 0.0;
    fVar16 = local_c0._4_4_ * 0.0;
    uVar1 = *(undefined8 *)M->x[1];
    fVar30 = (float)uVar1;
    fVar27 = (float)((ulong)uVar1 >> 0x20);
    local_128 = *(undefined8 *)M->x[0];
    fVar28 = (float)local_128;
    fVar14 = (float)((ulong)local_128 >> 0x20);
    uStack_120 = 0;
    uVar1 = *(undefined8 *)M->x[2];
    fVar13 = (float)uVar1;
    fVar15 = (float)((ulong)uVar1 >> 0x20);
    local_f8 = CONCAT44(fVar17 + fVar22 * fVar15 + fVar23 * fVar14 + fVar20 * fVar27,
                        fVar17 + fVar22 * fVar13 + fVar23 * fVar28 + fVar20 * fVar30);
    local_f0 = fVar18 + fVar17;
    local_e8 = CONCAT44(fVar21 + (float)local_88._0_4_ * fVar15 + fVar24 * fVar14 + fVar19 * fVar27,
                        fVar21 + (float)local_88._0_4_ * fVar13 + fVar24 * fVar28 + fVar19 * fVar30)
    ;
    local_e0 = local_58 + fVar21;
    local_dc = local_118;
    local_d8 = CONCAT44(fVar11 + local_b8 * fVar15 + fVar25 * fVar14 + fVar29 * fVar27,
                        fVar11 + local_b8 * fVar13 + fVar25 * fVar28 + fVar29 * fVar30);
    local_d0 = local_68 + fVar11;
    local_cc = local_b8 * 0.0 + fVar25 * 0.0 + fVar29 * 0.0 + fVar26;
    local_c8 = CONCAT44(fVar16 + (float)local_c0 * fVar15 +
                                 (float)local_c8 * fVar14 + local_c8._4_4_ * fVar27,
                        fVar16 + (float)local_c0 * fVar13 +
                                 (float)local_c8 * fVar28 + local_c8._4_4_ * fVar30);
    local_c0 = CONCAT44((float)local_c0 * 0.0 + fVar12 + fVar10 + local_c0._4_4_,local_78 + fVar16);
    uVar9 = uVar9 << 4;
    fVar10 = *(float *)((long)&local_f8 + uVar6 + uVar9);
    fVar11 = *(float *)((long)&local_f8 + lVar8 * 4 + (ulong)uVar9);
    fVar10 = atan2f(-*(float *)((long)&local_f8 + uVar7 * 4 + (ulong)uVar9),
                    SQRT(fVar10 * fVar10 + fVar11 * fVar11));
    (this->super_Vec3<float>).y = fVar10;
    fVar11 = -*(float *)((long)&local_f8 + uVar6 + lVar8 * 0x10);
    fVar10 = *(float *)((long)&local_f8 + lVar8 * 0x14);
  }
  else {
    uVar7 = (ulong)(uVar9 * 4);
    uVar6 = (ulong)uVar5;
    fVar10 = atan2f(*(float *)((long)M->x[lVar8] + uVar7),*(float *)((long)M->x[uVar6] + uVar7));
    (this->super_Vec3<float>).x = fVar10;
    local_138[0] = 0.0;
    local_138[1] = 0.0;
    local_138[2] = 0.0;
    if ((this->field_0xc & 4) != 0) {
      fVar10 = -fVar10;
    }
    *(float *)((long)local_138 + uVar7) = fVar10;
    fVar10 = local_138[2];
    local_c8 = 0;
    local_c0 = 0x3f80000000000000;
    local_108._0_4_ = cosf(local_138[2]);
    local_128 = CONCAT44(local_128._4_4_,local_138[1]);
    local_b8 = cosf(local_138[1]);
    local_98._0_4_ = local_138[0];
    uStack_b4 = extraout_XMM0_Db_01;
    uStack_b0 = extraout_XMM0_Dc_01;
    uStack_ac = extraout_XMM0_Dd_01;
    local_118 = cosf(local_138[0]);
    fVar10 = sinf(fVar10);
    local_a8._0_4_ = sinf((float)local_128);
    local_a8._4_4_ = extraout_XMM0_Db_02;
    local_a8._8_4_ = extraout_XMM0_Dc_02;
    local_a8._12_4_ = extraout_XMM0_Dd_02;
    fVar11 = sinf((float)local_98._0_4_);
    fVar21 = (float)local_108._0_4_ * (float)local_a8._0_4_ * fVar11 - fVar10 * local_118;
    fVar18 = (float)local_108._0_4_ * local_118 + fVar10 * (float)local_a8._0_4_ * fVar11;
    fVar15 = fVar10 * fVar11 + local_118 * (float)local_108._0_4_ * (float)local_a8._0_4_;
    fVar28 = local_118 * fVar10 * (float)local_a8._0_4_ - (float)local_108._0_4_ * fVar11;
    fVar12 = local_b8 * fVar10 * 0.0;
    fVar17 = -(float)local_a8._0_4_ * 0.0;
    fVar20 = (float)local_108._0_4_ * local_b8 + fVar12 + fVar17;
    fVar22 = (float)local_108._0_4_ * local_b8 * 0.0;
    fVar26 = local_b8 * fVar10 + fVar22 + fVar17;
    fVar22 = fVar22 + fVar12;
    fVar17 = fVar17 + fVar22;
    fVar22 = fVar22 - (float)local_a8._0_4_;
    fVar10 = fVar18 * 0.0;
    fVar12 = local_b8 * fVar11 * 0.0;
    fVar23 = fVar21 + fVar10 + fVar12;
    fVar21 = fVar21 * 0.0;
    fVar19 = fVar18 + fVar21 + fVar12;
    fVar21 = fVar21 + fVar10;
    local_78 = local_b8 * fVar11 + fVar21;
    fVar21 = fVar21 + fVar12;
    fVar10 = fVar28 * 0.0;
    fVar11 = local_b8 * local_118 * 0.0;
    fVar24 = fVar15 + fVar10 + fVar11;
    fVar15 = fVar15 * 0.0;
    fVar25 = fVar28 + fVar15 + fVar11;
    fVar15 = fVar15 + fVar10;
    local_b8 = local_b8 * local_118 + fVar15;
    fVar15 = fVar15 + fVar11;
    fVar10 = M->x[0][2];
    fVar11 = M->x[1][2];
    fVar12 = M->x[2][2];
    fVar18 = fVar22 * fVar12 + fVar20 * fVar10 + fVar26 * fVar11;
    local_98 = ZEXT416((uint)fVar18);
    uStack_74 = uStack_b4;
    uStack_70 = uStack_b0;
    uStack_6c = uStack_ac;
    local_a8._0_4_ = local_78 * fVar12 + fVar23 * fVar10 + fVar19 * fVar11;
    local_a8._4_4_ = uStack_b4;
    local_a8._8_4_ = uStack_b0;
    local_a8._12_4_ = uStack_ac;
    local_58 = local_b8 * fVar12 + fVar24 * fVar10 + fVar25 * fVar11;
    uStack_54 = uStack_b4;
    uStack_50 = uStack_b0;
    uStack_4c = uStack_ac;
    local_88 = ZEXT416((uint)local_c8._4_4_);
    local_68 = fVar12 * (float)local_c0 + fVar10 * (float)local_c8 + fVar11 * local_c8._4_4_;
    fVar10 = local_c8._4_4_ * 0.0;
    fVar30 = (float)local_c8 * 0.0;
    local_ec = fVar22 * 0.0 + fVar20 * 0.0 + fVar26 * 0.0 + fVar17;
    local_108 = ZEXT416((uint)local_ec);
    fVar17 = fVar17 * 0.0;
    local_118 = local_78 * 0.0 + fVar23 * 0.0 + fVar19 * 0.0 + fVar21;
    uStack_114 = uStack_b4;
    uStack_110 = uStack_b0;
    uStack_10c = uStack_ac;
    fVar21 = fVar21 * 0.0;
    fVar11 = fVar15 * 0.0;
    fVar16 = local_c0._4_4_ * 0.0;
    uVar1 = *(undefined8 *)M->x[1];
    fVar27 = (float)uVar1;
    fVar29 = (float)((ulong)uVar1 >> 0x20);
    local_128 = *(undefined8 *)M->x[0];
    fVar12 = (float)local_128;
    fVar13 = (float)((ulong)local_128 >> 0x20);
    uStack_120 = 0;
    uVar1 = *(undefined8 *)M->x[2];
    fVar28 = (float)uVar1;
    fVar14 = (float)((ulong)uVar1 >> 0x20);
    local_f8 = CONCAT44(fVar17 + fVar22 * fVar14 + fVar20 * fVar13 + fVar26 * fVar29,
                        fVar17 + fVar22 * fVar28 + fVar20 * fVar12 + fVar26 * fVar27);
    local_f0 = fVar18 + fVar17;
    local_e8 = CONCAT44(fVar21 + local_78 * fVar14 + fVar23 * fVar13 + fVar19 * fVar29,
                        fVar21 + local_78 * fVar28 + fVar23 * fVar12 + fVar19 * fVar27);
    local_e0 = (float)local_a8._0_4_ + fVar21;
    local_dc = local_118;
    local_d8 = CONCAT44(fVar11 + local_b8 * fVar14 + fVar24 * fVar13 + fVar25 * fVar29,
                        fVar11 + local_b8 * fVar28 + fVar24 * fVar12 + fVar25 * fVar27);
    local_d0 = local_58 + fVar11;
    local_cc = local_b8 * 0.0 + fVar24 * 0.0 + fVar25 * 0.0 + fVar15;
    local_c8 = CONCAT44(fVar16 + (float)local_c0 * fVar14 +
                                 (float)local_c8 * fVar13 + local_c8._4_4_ * fVar29,
                        fVar16 + (float)local_c0 * fVar28 +
                                 (float)local_c8 * fVar12 + local_c8._4_4_ * fVar27);
    local_c0 = CONCAT44((float)local_c0 * 0.0 + fVar30 + fVar10 + local_c0._4_4_,local_68 + fVar16);
    fVar10 = *(float *)((long)&local_f8 + uVar7 + lVar8 * 0x10);
    fVar11 = *(float *)((long)&local_f8 + uVar7 + uVar6 * 0x10);
    fVar10 = atan2f(SQRT(fVar10 * fVar10 + fVar11 * fVar11),
                    *(float *)((long)&local_f8 + uVar7 + (uVar9 << 4)));
    (this->super_Vec3<float>).y = fVar10;
    fVar11 = *(float *)((long)&local_f8 + uVar6 * 4 + lVar8 * 0x10);
    fVar10 = *(float *)((long)&local_f8 + lVar8 * 0x14);
  }
  fVar10 = atan2f(fVar11,fVar10);
  (this->super_Vec3<float>).z = fVar10;
  bVar2 = this->field_0xc;
  if ((bVar2 & 4) == 0) {
    uVar7._0_4_ = (this->super_Vec3<float>).x;
    uVar7._4_4_ = (this->super_Vec3<float>).y;
    (this->super_Vec3<float>).x = (float)(int)(uVar7 ^ 0x8000000080000000);
    (this->super_Vec3<float>).y = (float)(int)((uVar7 ^ 0x8000000080000000) >> 0x20);
    fVar10 = -fVar10;
    (this->super_Vec3<float>).z = fVar10;
  }
  if ((bVar2 & 1) == 0) {
    fVar11 = (this->super_Vec3<float>).x;
    (this->super_Vec3<float>).x = fVar10;
    (this->super_Vec3<float>).z = fVar11;
  }
  return;
}

Assistant:

IMATH_HOSTDEVICE void
Euler<T>::extract (const Matrix33<T>& M) IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    if (_initialRepeated)
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][i], M[k][i]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T sy = std::sqrt (N[j][i] * N[j][i] + N[k][i] * N[k][i]);
        y    = std::atan2 (sy, N[i][i]);
        z    = std::atan2 (N[j][k], N[j][j]);
    }
    else
    {
        //
        // Extract the first angle, x.
        //

        x = std::atan2 (M[j][k], M[k][k]);

        //
        // Remove the x rotation from M, so that the remaining
        // rotation, N, is only around two axes, and gimbal lock
        // cannot occur.
        //

        Vec3<T> r (0, 0, 0);
        r[i] = (_parityEven ? -x : x);

        Matrix44<T> N;
        N.rotate (r);

        N = N * Matrix44<T> (
                    M[0][0],
                    M[0][1],
                    M[0][2],
                    0,
                    M[1][0],
                    M[1][1],
                    M[1][2],
                    0,
                    M[2][0],
                    M[2][1],
                    M[2][2],
                    0,
                    0,
                    0,
                    0,
                    1);
        //
        // Extract the other two angles, y and z, from N.
        //

        T cy = std::sqrt (N[i][i] * N[i][i] + N[i][j] * N[i][j]);
        y    = std::atan2 (-N[i][k], cy);
        z    = std::atan2 (-N[j][i], N[j][j]);
    }

    if (!_parityEven) *this *= -1;

    if (!_frameStatic)
    {
        T t = x;
        x   = z;
        z   = t;
    }
}